

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rebuildPage(MemPage *pPg,int nCell,u8 **apCell,u16 *szCell)

{
  u32 uVar1;
  ushort *puVar2;
  u8 *puVar3;
  char *pcVar4;
  ushort *puVar5;
  undefined1 uVar6;
  ushort uVar7;
  ulong uVar8;
  ulong uVar9;
  ushort *__src;
  long lVar10;
  ushort *puVar11;
  ushort *__dest;
  
  uVar8 = (ulong)pPg->hdrOffset;
  puVar2 = (ushort *)pPg->aData;
  uVar1 = pPg->pBt->usableSize;
  lVar10 = (long)(int)uVar1;
  puVar3 = pPg->aCellIdx;
  pcVar4 = pPg->pBt->pPager->pTmpSpace;
  uVar7 = *(ushort *)((long)puVar2 + uVar8 + 5);
  uVar7 = uVar7 << 8 | uVar7 >> 8;
  memcpy(pcVar4 + uVar7,(void *)((ulong)uVar7 + (long)puVar2),(long)(int)(uVar1 - uVar7));
  if (nCell < 1) {
    uVar6 = (undefined1)(uVar1 >> 8);
  }
  else {
    puVar11 = (ushort *)(lVar10 + (long)puVar2);
    uVar9 = 0;
    __dest = puVar11;
    do {
      __dest = (ushort *)((long)__dest - (ulong)szCell[uVar9]);
      lVar10 = (long)__dest - (long)puVar2;
      puVar5 = (ushort *)apCell[uVar9];
      *(ushort *)(puVar3 + uVar9 * 2) = (ushort)lVar10 << 8 | (ushort)lVar10 >> 8;
      if (__dest < (ushort *)((long)(puVar3 + uVar9 * 2) + 2)) {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1103f,
                    "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
        return 0xb;
      }
      __src = (ushort *)((long)puVar5 + ((long)pcVar4 - (long)puVar2));
      if (puVar11 <= puVar5) {
        __src = puVar5;
      }
      if (puVar5 < puVar2) {
        __src = puVar5;
      }
      memcpy(__dest,__src,(ulong)szCell[uVar9]);
      uVar9 = uVar9 + 1;
    } while ((uint)nCell != uVar9);
    uVar6 = (undefined1)((ulong)lVar10 >> 8);
  }
  pPg->nCell = (u16)nCell;
  pPg->nOverflow = '\0';
  *(undefined2 *)((long)puVar2 + uVar8 + 1) = 0;
  *(undefined1 *)((long)puVar2 + uVar8 + 3) = *(undefined1 *)((long)&pPg->nCell + 1);
  *(char *)((long)puVar2 + uVar8 + 4) = (char)pPg->nCell;
  *(undefined1 *)((long)puVar2 + uVar8 + 5) = uVar6;
  *(char *)((long)puVar2 + uVar8 + 6) = (char)lVar10;
  *(undefined1 *)((long)puVar2 + uVar8 + 7) = 0;
  return 0;
}

Assistant:

static int rebuildPage(
  MemPage *pPg,                   /* Edit this page */
  int nCell,                      /* Final number of cells on page */
  u8 **apCell,                    /* Array of cells */
  u16 *szCell                     /* Array of cell sizes */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i;
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;

  i = get2byte(&aData[hdr+5]);
  memcpy(&pTmp[i], &aData[i], usableSize - i);

  pData = pEnd;
  for(i=0; i<nCell; i++){
    u8 *pCell = apCell[i];
    if( SQLITE_WITHIN(pCell,aData,pEnd) ){
      pCell = &pTmp[pCell - aData];
    }
    pData -= szCell[i];
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    if( pData < pCellptr ) return SQLITE_CORRUPT_BKPT;
    memcpy(pData, pCell, szCell[i]);
    assert( szCell[i]==pPg->xCellSize(pPg, pCell) || CORRUPT_DB );
    testcase( szCell[i]!=pPg->xCellSize(pPg,pCell) );
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
  return SQLITE_OK;
}